

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlUnicodeString.cpp
# Opt level: O1

void __thiscall libebml::UTFstring::UTFstring(UTFstring *this,wstring *_aBuf)

{
  this->_vptr_UTFstring = (_func_int **)&PTR__UTFstring_001cde18;
  this->_Length = 0;
  this->_Data = (wchar_t *)0x0;
  (this->UTF8string)._M_dataplus._M_p = (pointer)&(this->UTF8string).field_2;
  (this->UTF8string)._M_string_length = 0;
  (this->UTF8string).field_2._M_local_buf[0] = '\0';
  operator=(this,*(wchar_t **)_aBuf);
  return;
}

Assistant:

UTFstring::UTFstring(std::wstring const &_aBuf)
  :_Length(0)
  ,_Data(NULL)
{
  *this = _aBuf.c_str();
}